

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D_adaptive<vector_malloc<unsigned_char*,16u>>
               (uchar **strings,size_t n,size_t depth,vector_malloc<unsigned_char_*,_16U> *buckets)

{
  vector_malloc<unsigned_char_*,_16U> *pvVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t j;
  long *__ptr;
  long lVar4;
  size_t sVar5;
  uchar *puVar6;
  size_t *psVar7;
  ushort uVar8;
  ulong uVar9;
  uint i;
  size_t j_1;
  size_t sVar10;
  long lVar11;
  uchar **ppuVar12;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_malloc<unsigned_char*,16u>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    sVar10 = 0;
  }
  else {
    sVar10 = 0;
    ppuVar12 = strings;
    do {
      lVar4 = 0;
      do {
        puVar6 = ppuVar12[lVar4];
        if (puVar6 == (uchar *)0x0) goto LAB_001a0b0f;
        if (puVar6[depth] == '\0') {
          uVar8 = 0;
        }
        else {
          uVar8 = CONCAT11(puVar6[depth],puVar6[depth + 1]);
        }
        auStack_58[lVar4] = uVar8;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      lVar4 = 0;
      do {
        pvVar1 = buckets + auStack_58[lVar4];
        sVar5 = pvVar1->_size;
        if (sVar5 == pvVar1->_capacity) {
          vector_malloc<unsigned_char_*,_16U>::grow(pvVar1);
          sVar5 = pvVar1->_size;
        }
        pvVar1->_data[sVar5] = ppuVar12[lVar4];
        pvVar1->_size = sVar5 + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      sVar10 = sVar10 + 0x10;
      ppuVar12 = ppuVar12 + 0x10;
    } while (sVar10 < (n & 0xfffffffffffffff0));
  }
  if (sVar10 < n) {
    do {
      puVar6 = strings[sVar10];
      if (puVar6 == (uchar *)0x0) {
LAB_001a0b0f:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar6[depth] == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)CONCAT11(puVar6[depth],puVar6[depth + 1]);
      }
      pvVar1 = buckets + uVar9;
      sVar5 = pvVar1->_size;
      if (sVar5 == pvVar1->_capacity) {
        vector_malloc<unsigned_char_*,_16U>::grow(pvVar1);
        sVar5 = pvVar1->_size;
        puVar6 = strings[sVar10];
      }
      pvVar1->_data[sVar5] = puVar6;
      pvVar1->_size = sVar5 + 1;
      sVar10 = sVar10 + 1;
    } while (n != sVar10);
  }
  psVar7 = &buckets->_size;
  lVar4 = 0;
  do {
    __ptr[lVar4] = *psVar7;
    lVar4 = lVar4 + 1;
    psVar7 = psVar7 + 3;
  } while (lVar4 != 0x10000);
  psVar7 = &buckets->_size;
  lVar11 = 0;
  lVar4 = 0;
  do {
    lVar3 = __ptr[lVar11];
    if (lVar3 != 0) {
      if (*psVar7 != 0) {
        memmove(strings + lVar4,((vector_malloc<unsigned_char_*,_16U> *)(psVar7 + -1))->_data,
                *psVar7 << 3);
      }
      lVar4 = lVar4 + lVar3;
    }
    lVar11 = lVar11 + 1;
    psVar7 = psVar7 + 3;
  } while (lVar11 != 0x10000);
  lVar4 = 0;
  do {
    free(*(void **)((long)&buckets->_data + lVar4));
    puVar2 = (undefined8 *)((long)&buckets->_data + lVar4);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)&buckets->_capacity + lVar4) = 0;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x180000);
  lVar4 = *__ptr;
  lVar11 = 1;
  do {
    sVar10 = __ptr[lVar11];
    if (sVar10 != 0) {
      if ((char)lVar11 != '\0') {
        msd_D_adaptive<vector_malloc<unsigned_char*,16u>>(strings + lVar4,sVar10,depth + 2,buckets);
      }
      lVar4 = lVar4 + sVar10;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}